

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

bool __thiscall presolve::HPresolve::isImpliedEquationAtLower(HPresolve *this,HighsInt row)

{
  double *pdVar1;
  double dVar2;
  
  dVar2 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  pdVar1 = &(this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  return *pdVar1 <= dVar2 && dVar2 != *pdVar1;
}

Assistant:

bool HPresolve::isImpliedEquationAtLower(HighsInt row) const {
  // if the implied lower bound on a row dual is strictly positive then the row
  // is an implied equation (using its lower bound) due to complementary
  // slackness
  bool isLbndPositive =
      implRowDualLower[row] > options->dual_feasibility_tolerance;
  assert(!isLbndPositive || model->row_lower_[row] != -kHighsInf);
  return isLbndPositive;
}